

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

Regexp * __thiscall re2::Regexp::ParseState::DoFinish(ParseState *this)

{
  RegexpStatus *pRVar1;
  Regexp *pRVar2;
  ParseState *this_00;
  
  this_00 = this;
  DoAlternation(this);
  pRVar2 = this->stacktop_;
  if ((pRVar2 != (Regexp *)0x0) && (pRVar2->down_ != (Regexp *)0x0)) {
    pRVar1 = this->status_;
    pRVar1->code_ = kRegexpMissingParen;
    (pRVar1->error_arg_).ptr_ = (this->whole_regexp_).ptr_;
    (pRVar1->error_arg_).length_ = (this->whole_regexp_).length_;
    return (Regexp *)0x0;
  }
  this->stacktop_ = (Regexp *)0x0;
  pRVar2 = FinishRegexp(this_00,pRVar2);
  return pRVar2;
}

Assistant:

Regexp* Regexp::ParseState::DoFinish() {
  DoAlternation();
  Regexp* re = stacktop_;
  if (re != NULL && re->down_ != NULL) {
    status_->set_code(kRegexpMissingParen);
    status_->set_error_arg(whole_regexp_);
    return NULL;
  }
  stacktop_ = NULL;
  return FinishRegexp(re);
}